

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O3

void ReadToString(string *filename,string *s)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  undefined8 extraout_RAX;
  undefined1 *unaff_RBX;
  char buffer [8092];
  undefined1 *local_1ff8 [2];
  undefined1 local_1fe8 [16];
  undefined1 local_1fd8 [8104];
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
LAB_00105e01:
    ReadToString();
    if (local_1ff8[0] != unaff_RBX) {
      operator_delete(local_1ff8[0]);
    }
    _Unwind_Resume(extraout_RAX);
  }
  sVar2 = fread(local_1fd8,1,0x1f9c,__stream);
  if (sVar2 != 0) {
    unaff_RBX = local_1fe8;
    do {
      iVar1 = ferror(__stream);
      if (iVar1 != 0) {
        ReadToString();
        goto LAB_00105e01;
      }
      local_1ff8[0] = unaff_RBX;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1ff8,local_1fd8,local_1fd8 + sVar2);
      std::__cxx11::string::_M_append((char *)s,(ulong)local_1ff8[0]);
      if (local_1ff8[0] != unaff_RBX) {
        operator_delete(local_1ff8[0]);
      }
      sVar2 = fread(local_1fd8,1,0x1f9c,__stream);
    } while (sVar2 != 0);
  }
  fclose(__stream);
  return;
}

Assistant:

static void ReadToString(const string& filename, string* s) {
  const int bufsize = 8092;
  char buffer[bufsize];
  size_t n;
  FILE* fp = fopen(filename.c_str(), "rb");
  if (!fp)  PFATAL(filename.c_str());
  while ((n=fread(buffer, 1, bufsize, fp)) > 0) {
    if (ferror(fp))  PFATAL(filename.c_str());
    s->append(string(buffer, n));
  }
  fclose(fp);
}